

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_handle_events(CImgDisplay *this,XEvent *pevent)

{
  int iVar1;
  int iVar2;
  X11_info *pXVar3;
  uint local_1f4;
  uint local_1c0 [2];
  KeySym ksym_1;
  char tmp_1;
  uint uStack_1b0;
  bool is_key_pressed;
  uint kc2;
  uint kc1;
  uint kc;
  char keys_return [32];
  KeySym ksym;
  undefined1 local_178 [7];
  char tmp;
  XWindowAttributes attr;
  int ny;
  int nx;
  uint nh;
  uint nw;
  XEvent event;
  Display *dpy;
  XEvent *pevent_local;
  CImgDisplay *this_local;
  
  dpy = (Display *)pevent;
  pevent_local = (XEvent *)this;
  pXVar3 = cimg::X11_attr();
  event.pad[0x17] = (long)pXVar3->display;
  memcpy(&nh,dpy,0xc0);
  switch(nh) {
  case 2:
    ksym._7_1_ = 0;
    XLookupString(&nh,(long)&ksym + 7,1,keys_return + 0x18,0);
    set_key(this,keys_return._24_4_,true);
    break;
  case 3:
    XQueryKeymap(event.pad[0x17],&kc1);
    kc2 = event.xkey.y_root;
    uStack_1b0 = (uint)event.xkey.y_root >> 3;
    ksym_1._4_4_ = event.xkey.y_root & 7;
    if (uStack_1b0 < 0x20) {
      local_1f4 = (int)*(char *)((long)&kc1 + (ulong)uStack_1b0) >> (sbyte)ksym_1._4_4_ & 1;
    }
    else {
      local_1f4 = 0;
    }
    ksym_1._3_1_ = local_1f4 != 0;
    if (!(bool)ksym_1._3_1_) {
      ksym_1._2_1_ = 0;
      XLookupString(&nh,(long)&ksym_1 + 2,1,local_1c0,0);
      set_key(this,local_1c0[0],false);
    }
    break;
  case 4:
    do {
      this->_mouse_x = event.xexpose.count;
      this->_mouse_y = event.xgraphicsexpose.major_code;
      if ((((this->_mouse_x < 0) || (this->_mouse_y < 0)) ||
          (iVar1 = this->_mouse_x, iVar2 = width(this), iVar2 <= iVar1)) ||
         (iVar1 = this->_mouse_y, iVar2 = height(this), iVar2 <= iVar1)) {
        this->_mouse_y = -1;
        this->_mouse_x = this->_mouse_y;
      }
      if (event.xkey.y_root == 1) {
        set_button(this,1,true);
      }
      else if (event.xkey.y_root == 2) {
        set_button(this,3,true);
      }
      else if (event.xkey.y_root == 3) {
        set_button(this,2,true);
      }
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,4,&nh);
    } while (iVar1 != 0);
    break;
  case 5:
    do {
      this->_mouse_x = event.xexpose.count;
      this->_mouse_y = event.xgraphicsexpose.major_code;
      if (((this->_mouse_x < 0) || (this->_mouse_y < 0)) ||
         ((iVar1 = this->_mouse_x, iVar2 = width(this), iVar2 <= iVar1 ||
          (iVar1 = this->_mouse_y, iVar2 = height(this), iVar2 <= iVar1)))) {
        this->_mouse_y = -1;
        this->_mouse_x = this->_mouse_y;
      }
      switch(event.xkey.y_root) {
      case 1:
        set_button(this,1,false);
        break;
      case 2:
        set_button(this,3,false);
        break;
      case 3:
        set_button(this,2,false);
        break;
      case 4:
        set_wheel(this,1);
        break;
      case 5:
        set_wheel(this,-1);
      }
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,8,&nh);
    } while (iVar1 != 0);
    break;
  case 6:
    do {
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,0x40,&nh);
    } while (iVar1 != 0);
    this->_mouse_x = event.xexpose.count;
    this->_mouse_y = event.xgraphicsexpose.major_code;
    if (((this->_mouse_x < 0) || (this->_mouse_y < 0)) ||
       ((iVar1 = this->_mouse_x, iVar2 = width(this), iVar2 <= iVar1 ||
        (iVar1 = this->_mouse_y, iVar2 = height(this), iVar2 <= iVar1)))) {
      this->_mouse_y = -1;
      this->_mouse_x = this->_mouse_y;
    }
    this->_is_event = true;
    pXVar3 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    break;
  case 7:
    do {
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,0x10,&nh);
    } while (iVar1 != 0);
    this->_mouse_x = event.xexpose.count;
    this->_mouse_y = event.xgraphicsexpose.major_code;
    if ((((this->_mouse_x < 0) || (this->_mouse_y < 0)) ||
        (iVar1 = this->_mouse_x, iVar2 = width(this), iVar2 <= iVar1)) ||
       (iVar1 = this->_mouse_y, iVar2 = height(this), iVar2 <= iVar1)) {
      this->_mouse_y = -1;
      this->_mouse_x = this->_mouse_y;
    }
    break;
  case 8:
    do {
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,0x20,&nh);
    } while (iVar1 != 0);
    this->_mouse_y = -1;
    this->_mouse_x = this->_mouse_y;
    this->_is_event = true;
    pXVar3 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    break;
  case 0xc:
    do {
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,0x8000,&nh);
    } while (iVar1 != 0);
    _paint(this,false);
    if ((this->_is_fullscreen & 1U) != 0) {
      XGetWindowAttributes(event.pad[0x17],this->_window,local_178);
      while (attr.colormap._4_4_ != 2) {
        XSync(event.pad[0x17],0);
      }
      XSetInputFocus(event.pad[0x17],this->_window,2,0);
    }
    break;
  case 0x16:
    do {
      iVar1 = XCheckWindowEvent(event.pad[0x17],this->_window,0x20000,&nh);
    } while (iVar1 != 0);
    attr.screen._4_4_ = event.xfocus.mode;
    attr.screen._0_4_ = event.xfocus.detail;
    if (((event.xexpose.width != 0) && (event.xexpose.height != 0)) &&
       ((event.xexpose.width != this->_window_width ||
        (event.xexpose.height != this->_window_height)))) {
      this->_window_width = event.xexpose.width;
      this->_window_height = event.xexpose.height;
      this->_mouse_y = -1;
      this->_mouse_x = this->_mouse_y;
      XResizeWindow(event.pad[0x17],this->_window,this->_window_width,this->_window_height);
      this->_is_event = true;
      this->_is_resized = (bool)(this->_is_event & 1);
      pXVar3 = cimg::X11_attr();
      pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    }
    if ((attr.screen._4_4_ != this->_window_x) || ((int)attr.screen != this->_window_y)) {
      this->_window_x = attr.screen._4_4_;
      this->_window_y = (int)attr.screen;
      this->_is_event = true;
      this->_is_moved = (bool)(this->_is_event & 1);
      pXVar3 = cimg::X11_attr();
      pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    }
    break;
  case 0x21:
    if ((event.xgeneric.extension == (int)this->_wm_protocol_atom) &&
       (event.xexpose.width == (int)this->_wm_window_atom)) {
      pXVar3 = cimg::X11_attr();
      XUnmapWindow(pXVar3->display,this->_window);
      this->_is_event = true;
      this->_is_closed = (bool)(this->_is_event & 1);
      pXVar3 = cimg::X11_attr();
      pthread_cond_broadcast((pthread_cond_t *)&pXVar3->wait_event);
    }
  }
  return;
}

Assistant:

void _handle_events(const XEvent *const pevent) {
      Display *const dpy = cimg::X11_attr().display;
      XEvent event = *pevent;
      switch (event.type) {
      case ClientMessage : {
        if ((int)event.xclient.message_type==(int)_wm_protocol_atom &&
            (int)event.xclient.data.l[0]==(int)_wm_window_atom) {
          XUnmapWindow(cimg::X11_attr().display,_window);
          _is_closed = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case ConfigureNotify : {
        while (XCheckWindowEvent(dpy,_window,StructureNotifyMask,&event)) {}
        const unsigned int nw = event.xconfigure.width, nh = event.xconfigure.height;
        const int nx = event.xconfigure.x, ny = event.xconfigure.y;
        if (nw && nh && (nw!=_window_width || nh!=_window_height)) {
          _window_width = nw; _window_height = nh; _mouse_x = _mouse_y = -1;
          XResizeWindow(dpy,_window,_window_width,_window_height);
          _is_resized = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
        if (nx!=_window_x || ny!=_window_y) {
          _window_x = nx; _window_y = ny; _is_moved = _is_event = true;
          pthread_cond_broadcast(&cimg::X11_attr().wait_event);
        }
      } break;
      case Expose : {
        while (XCheckWindowEvent(dpy,_window,ExposureMask,&event)) {}
        _paint(false);
        if (_is_fullscreen) {
          XWindowAttributes attr;
          XGetWindowAttributes(dpy,_window,&attr);
          while (attr.map_state!=IsViewable) XSync(dpy,0);
          XSetInputFocus(dpy,_window,RevertToParent,CurrentTime);
        }
      } break;
      case ButtonPress : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1); break;
          case 3 : set_button(2); break;
          case 2 : set_button(3); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonPressMask,&event));
      } break;
      case ButtonRelease : {
        do {
          _mouse_x = event.xmotion.x; _mouse_y = event.xmotion.y;
          if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
          switch (event.xbutton.button) {
          case 1 : set_button(1,false); break;
          case 3 : set_button(2,false); break;
          case 2 : set_button(3,false); break;
          case 4 : set_wheel(1); break;
          case 5 : set_wheel(-1); break;
          }
        } while (XCheckWindowEvent(dpy,_window,ButtonReleaseMask,&event));
      } break;
      case KeyPress : {
        char tmp = 0; KeySym ksym;
        XLookupString(&event.xkey,&tmp,1,&ksym,0);
        set_key((unsigned int)ksym,true);
      } break;
      case KeyRelease : {
        char keys_return[32];  // Check that the key has been physically unpressed.
        XQueryKeymap(dpy,keys_return);
        const unsigned int kc = event.xkey.keycode, kc1 = kc/8, kc2 = kc%8;
        const bool is_key_pressed = kc1>=32?false:(keys_return[kc1]>>kc2)&1;
        if (!is_key_pressed) {
          char tmp = 0; KeySym ksym;
          XLookupString(&event.xkey,&tmp,1,&ksym,0);
          set_key((unsigned int)ksym,false);
        }
      } break;
      case EnterNotify: {
        while (XCheckWindowEvent(dpy,_window,EnterWindowMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
      } break;
      case LeaveNotify : {
        while (XCheckWindowEvent(dpy,_window,LeaveWindowMask,&event)) {}
        _mouse_x = _mouse_y =-1; _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      case MotionNotify : {
        while (XCheckWindowEvent(dpy,_window,PointerMotionMask,&event)) {}
        _mouse_x = event.xmotion.x;
        _mouse_y = event.xmotion.y;
        if (_mouse_x<0 || _mouse_y<0 || _mouse_x>=width() || _mouse_y>=height()) _mouse_x = _mouse_y = -1;
        _is_event = true;
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
      } break;
      }
    }